

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags,ImGuiWindow *outer_window)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = flags & 0xe000;
  if (uVar1 == 0) {
    uVar1 = 0x2000;
    if ((((uint)flags >> 0x17 & 1) == 0) && (uVar1 = 0x2000, (outer_window->Flags & 0x40) == 0)) {
      uVar1 = 0x8000;
    }
    flags = flags | uVar1;
  }
  uVar3 = flags | 0x20000;
  if (uVar1 != 0x4000) {
    uVar3 = flags;
  }
  uVar1 = (uVar3 & 1) << 9;
  uVar2 = uVar1 | uVar3;
  uVar1 = uVar1 | uVar3 & 0xfffeffff;
  if ((uVar3 & 0x1800000) == 0) {
    uVar1 = uVar2;
  }
  if ((uVar3 >> 0x10 & 1) == 0) {
    uVar1 = uVar2;
  }
  uVar3 = uVar1 & 0xfffff7ff;
  if ((uVar1 >> 0xc & 1) == 0) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3;
  if ((uVar3 & 0xf) == 0) {
    uVar1 = uVar3 | 0x10;
  }
  if ((outer_window->RootWindow->Flags & 0x100) != 0) {
    uVar1 = uVar3 | 0x10;
  }
  return uVar1;
}

Assistant:

inline ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags, ImGuiWindow* outer_window)
{
    // Adjust flags: set default sizing policy
    if ((flags & ImGuiTableFlags_SizingMask_) == 0)
        flags |= ((flags & ImGuiTableFlags_ScrollX) || (outer_window->Flags & ImGuiWindowFlags_AlwaysAutoResize)) ? ImGuiTableFlags_SizingFixedFit : ImGuiTableFlags_SizingStretchSame;

    // Adjust flags: enable NoKeepColumnsVisible when using ImGuiTableFlags_SizingFixedSame
    if ((flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
        flags |= ImGuiTableFlags_NoKeepColumnsVisible;

    // Adjust flags: enforce borders when resizable
    if (flags & ImGuiTableFlags_Resizable)
        flags |= ImGuiTableFlags_BordersInnerV;

    // Adjust flags: disable NoHostExtendY if we have any scrolling going on
    if ((flags & ImGuiTableFlags_NoHostExtendY) && (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0)
        flags &= ~ImGuiTableFlags_NoHostExtendY;

    // Adjust flags: NoBordersInBodyUntilResize takes priority over NoBordersInBody
    if (flags & ImGuiTableFlags_NoBordersInBodyUntilResize)
        flags &= ~ImGuiTableFlags_NoBordersInBody;

    // Adjust flags: disable saved settings if there's nothing to save
    if ((flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Hideable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Sortable)) == 0)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Inherit _NoSavedSettings from top-level window (child windows always have _NoSavedSettings set)
#ifdef IMGUI_HAS_DOCK
    ImGuiWindow* window_for_settings = outer_window->RootWindowDockStop;
#else
    ImGuiWindow* window_for_settings = outer_window->RootWindow;
#endif
    if (window_for_settings->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    return flags;
}